

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_crl.cc
# Opt level: O1

int crl_lookup(X509_CRL *crl,X509_REVOKED **ret,ASN1_INTEGER *serial,X509_NAME *issuer)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  X509_REVOKED *pXVar4;
  X509_NAME *b;
  size_t idx;
  X509_REVOKED rtmp;
  ulong local_58;
  ASN1_INTEGER *local_50 [4];
  
  if ((serial->type | 0x100U) != 0x102) {
    __assert_fail("serial->type == V_ASN1_INTEGER || serial->type == V_ASN1_NEG_INTEGER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x_crl.cc"
                  ,0x132,
                  "int crl_lookup(X509_CRL *, X509_REVOKED **, const ASN1_INTEGER *, X509_NAME *)");
  }
  local_50[0] = serial;
  CRYPTO_MUTEX_lock_read(&g_crl_sort_lock);
  iVar2 = OPENSSL_sk_is_sorted((OPENSSL_STACK *)crl->crl->revoked);
  CRYPTO_MUTEX_unlock_read(&g_crl_sort_lock);
  if (iVar2 == 0) {
    CRYPTO_MUTEX_lock_write(&g_crl_sort_lock);
    iVar2 = OPENSSL_sk_is_sorted((OPENSSL_STACK *)crl->crl->revoked);
    if (iVar2 == 0) {
      OPENSSL_sk_sort((OPENSSL_STACK *)crl->crl->revoked,sk_X509_REVOKED_call_cmp_func);
    }
    CRYPTO_MUTEX_unlock_write(&g_crl_sort_lock);
  }
  iVar2 = OPENSSL_sk_find((OPENSSL_STACK *)crl->crl->revoked,&local_58,local_50,
                          sk_X509_REVOKED_call_cmp_func);
  if (iVar2 != 0) {
    for (; uVar1 = local_58, sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)crl->crl->revoked),
        uVar1 < sVar3; local_58 = local_58 + 1) {
      pXVar4 = (X509_REVOKED *)OPENSSL_sk_value((OPENSSL_STACK *)crl->crl->revoked,local_58);
      iVar2 = ASN1_INTEGER_cmp((ASN1_INTEGER *)pXVar4->serialNumber,(ASN1_INTEGER *)serial);
      if (iVar2 != 0) {
        return 0;
      }
      if (issuer == (X509_NAME *)0x0) {
LAB_001b4564:
        if (ret == (X509_REVOKED **)0x0) {
          return 1;
        }
        *ret = pXVar4;
        return 1;
      }
      b = X509_CRL_get_issuer(crl);
      iVar2 = X509_NAME_cmp((X509_NAME *)issuer,(X509_NAME *)b);
      if (iVar2 == 0) goto LAB_001b4564;
    }
  }
  return 0;
}

Assistant:

static int crl_lookup(X509_CRL *crl, X509_REVOKED **ret,
                      const ASN1_INTEGER *serial, X509_NAME *issuer) {
  // Use an assert, rather than a runtime error, because returning nothing for a
  // CRL is arguably failing open, rather than closed.
  assert(serial->type == V_ASN1_INTEGER || serial->type == V_ASN1_NEG_INTEGER);
  X509_REVOKED rtmp, *rev;
  size_t idx;
  rtmp.serialNumber = (ASN1_INTEGER *)serial;
  // Sort revoked into serial number order if not already sorted. Do this
  // under a lock to avoid race condition.

  CRYPTO_MUTEX_lock_read(&g_crl_sort_lock);
  const int is_sorted = sk_X509_REVOKED_is_sorted(crl->crl->revoked);
  CRYPTO_MUTEX_unlock_read(&g_crl_sort_lock);

  if (!is_sorted) {
    CRYPTO_MUTEX_lock_write(&g_crl_sort_lock);
    if (!sk_X509_REVOKED_is_sorted(crl->crl->revoked)) {
      sk_X509_REVOKED_sort(crl->crl->revoked);
    }
    CRYPTO_MUTEX_unlock_write(&g_crl_sort_lock);
  }

  if (!sk_X509_REVOKED_find(crl->crl->revoked, &idx, &rtmp)) {
    return 0;
  }
  // Need to look for matching name
  for (; idx < sk_X509_REVOKED_num(crl->crl->revoked); idx++) {
    rev = sk_X509_REVOKED_value(crl->crl->revoked, idx);
    if (ASN1_INTEGER_cmp(rev->serialNumber, serial)) {
      return 0;
    }
    if (crl_revoked_issuer_match(crl, issuer, rev)) {
      if (ret) {
        *ret = rev;
      }
      return 1;
    }
  }
  return 0;
}